

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O2

void crnlib::utils::endian_swap_mem16(uint16 *p,uint n)

{
  ushort *puVar1;
  long lVar2;
  
  for (lVar2 = 0; n != (uint)lVar2; lVar2 = lVar2 + 1) {
    puVar1 = p + lVar2;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  return;
}

Assistant:

inline void endian_swap_mem16(uint16* p, uint n) {
  while (n--) {
    *p = swap16(*p);
    ++p;
  }
}